

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

model_node_type * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::split_downwards
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          model_node_type *parent,int bucketID,int fanout_tree_depth,
          vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
          *used_fanout_tree_nodes,bool reuse_model)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *pAVar5;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *this_00;
  uint in_ECX;
  int in_EDX;
  model_node_type *in_RSI;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RDI;
  byte in_R9B;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  bool in_stack_0000000b;
  int in_stack_0000000c;
  model_node_type *in_stack_00000010;
  data_node_type *in_stack_00000018;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_stack_00000020;
  int in_stack_00000030;
  int i;
  double right_boundary_value;
  double left_boundary_value;
  int end_bucketID;
  int start_bucketID;
  int repeats;
  model_node_type *new_node;
  int fanout;
  data_node_type *leaf;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  size_type in_stack_ffffffffffffff58;
  undefined1 *__n;
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffff60;
  int local_7c;
  AlexNode<int,_int> *in_stack_ffffffffffffff88;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffff90;
  undefined1 local_55 [21];
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *local_40;
  int local_34;
  AlexNode<int,_int> *local_30;
  byte local_21;
  uint local_18;
  int local_14;
  model_node_type *local_10;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *pAVar6;
  int start_bucketID_00;
  
  local_21 = in_R9B & 1;
  local_30 = in_RSI->children_[in_EDX];
  (in_RDI->stats_).num_downward_splits = (in_RDI->stats_).num_downward_splits + 1;
  (in_RDI->stats_).num_downward_split_keys =
       (in_RDI->stats_).num_downward_split_keys + (long)*(int *)&local_30[2].field_0xc;
  local_34 = 1 << (in_ECX & 0x1f);
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  pAVar6 = in_RDI;
  model_node_allocator
            ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  start_bucketID_00 = (int)((ulong)pAVar6 >> 0x20);
  pAVar5 = __gnu_cxx::
           new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
           allocate((new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
                     *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                    (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::AlexModelNode
            (in_stack_ffffffffffffff60,(short)(in_stack_ffffffffffffff58 >> 0x30),
             (allocator<std::pair<int,_int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::~allocator
            ((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *)
             0x1666e6);
  (pAVar5->super_AlexNode<int,_int>).duplication_factor_ = local_30->duplication_factor_;
  pAVar5->num_children_ = local_34;
  __n = local_55;
  local_40 = pAVar5;
  pointer_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *
                    )CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  this_00 = (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
            __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                      ((new_allocator<alex::AlexNode<int,_int>_*> *)in_stack_ffffffffffffff60,
                       (size_type)__n,
                       (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_40->children_ = (AlexNode<int,_int> **)this_00;
  std::allocator<alex::AlexNode<int,_int>_*>::~allocator
            ((allocator<alex::AlexNode<int,_int>_*> *)0x16675b);
  iVar3 = 1 << (local_30->duplication_factor_ & 0x1f);
  local_7c = local_14 - local_14 % iVar3;
  iVar4 = local_7c + iVar3;
  dVar1 = (local_10->super_AlexNode<int,_int>).model_.a_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    in_stack_ffffffffffffff90 =
         (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
         (((double)local_7c - (local_10->super_AlexNode<int,_int>).model_.b_) /
         (local_10->super_AlexNode<int,_int>).model_.a_);
    in_stack_ffffffffffffff88 =
         (AlexNode<int,_int> *)
         (((double)iVar4 - (local_10->super_AlexNode<int,_int>).model_.b_) /
         (local_10->super_AlexNode<int,_int>).model_.a_);
    (local_40->super_AlexNode<int,_int>).model_.a_ =
         (1.0 / ((double)in_stack_ffffffffffffff88 - (double)in_stack_ffffffffffffff90)) *
         (double)local_34;
    (local_40->super_AlexNode<int,_int>).model_.b_ =
         -(local_40->super_AlexNode<int,_int>).model_.a_ * (double)in_stack_ffffffffffffff90;
  }
  else {
    (local_40->super_AlexNode<int,_int>).model_.a_ = 0.0;
    (local_40->super_AlexNode<int,_int>).model_.b_ =
         (((double)local_7c - (local_10->super_AlexNode<int,_int>).model_.b_) * -1.0) /
         (double)iVar3;
  }
  bVar2 = std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::empty
                    (this_00);
  if (bVar2) {
    if (local_18 != 1) {
      __assert_fail("fanout_tree_depth == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                    ,0x650,
                    "model_node_type *alex::Alex<int, int>::split_downwards(model_node_type *, int, int, std::vector<fanout_tree::FTNode> &, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                   );
    }
    create_two_new_data_nodes
              (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
               in_stack_0000000b,unaff_retaddr_00);
  }
  else {
    create_new_data_nodes
              (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
               (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
               CONCAT44(unaff_retaddr_00,unaff_retaddr),start_bucketID_00,in_stack_00000030);
  }
  delete_node(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  (in_RDI->stats_).num_data_nodes = (in_RDI->stats_).num_data_nodes + -1;
  (in_RDI->stats_).num_model_nodes = (in_RDI->stats_).num_model_nodes + 1;
  for (; local_7c < iVar4; local_7c = local_7c + 1) {
    local_10->children_[local_7c] = &local_40->super_AlexNode<int,_int>;
  }
  if (local_10 == in_RDI->superroot_) {
    in_RDI->root_node_ = &local_40->super_AlexNode<int,_int>;
    update_superroot_pointer(in_RDI);
  }
  return local_40;
}

Assistant:

model_node_type* split_downwards(
      model_node_type* parent, int bucketID, int fanout_tree_depth,
      std::vector<fanout_tree::FTNode>& used_fanout_tree_nodes,
      bool reuse_model) {
    auto leaf = static_cast<data_node_type*>(parent->children_[bucketID]);
    stats_.num_downward_splits++;
    stats_.num_downward_split_keys += leaf->num_keys_;

    // Create the new model node that will replace the current data node
    int fanout = 1 << fanout_tree_depth;
    auto new_node = new (model_node_allocator().allocate(1))
        model_node_type(leaf->level_, allocator_);
    new_node->duplication_factor_ = leaf->duplication_factor_;
    new_node->num_children_ = fanout;
    new_node->children_ =
        new (pointer_allocator().allocate(fanout)) AlexNode<T, P>*[fanout];

    int repeats = 1 << leaf->duplication_factor_;
    int start_bucketID =
        bucketID - (bucketID % repeats);  // first bucket with same child
    int end_bucketID =
        start_bucketID + repeats;  // first bucket with different child
    if (parent->model_.a_ == 0){
      new_node->model_.a_ = 0;
      new_node->model_.b_ = -1.0 * (start_bucketID - parent->model_.b_) / repeats;
    }
    else{
      double left_boundary_value =
          (start_bucketID - parent->model_.b_) / parent->model_.a_;
      double right_boundary_value =
          (end_bucketID - parent->model_.b_) / parent->model_.a_;
      new_node->model_.a_ =
          1.0 / (right_boundary_value - left_boundary_value) * fanout;
      new_node->model_.b_ = -new_node->model_.a_ * left_boundary_value;
    }

    // Create new data nodes
    if (used_fanout_tree_nodes.empty()) {
      assert(fanout_tree_depth == 1);
      create_two_new_data_nodes(leaf, new_node, fanout_tree_depth, reuse_model);
    } else {
      create_new_data_nodes(leaf, new_node, fanout_tree_depth,
                            used_fanout_tree_nodes);
    }

    delete_node(leaf);
    stats_.num_data_nodes--;
    stats_.num_model_nodes++;
    for (int i = start_bucketID; i < end_bucketID; i++) {
      parent->children_[i] = new_node;
    }
    if (parent == superroot_) {
      root_node_ = new_node;
      update_superroot_pointer();
    }

    return new_node;
  }